

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O2

void Cmd_load(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  FString fname;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 2) {
    if (netgame != true) {
      pcVar2 = FCommandLine::operator[](argv,1);
      FString::FString(&fname,pcVar2);
      DefaultExtension(&fname,".zds");
      G_LoadGame(fname.Chars,false);
      FString::~FString(&fname);
      return;
    }
    pcVar2 = "cannot load during a network game\n";
  }
  else {
    pcVar2 = "usage: load <filename>\n";
  }
  Printf(pcVar2);
  return;
}

Assistant:

CCMD (load)
{
    if (argv.argc() != 2)
	{
        Printf ("usage: load <filename>\n");
        return;
    }
	if (netgame)
	{
		Printf ("cannot load during a network game\n");
		return;
	}
	FString fname = argv[1];
	DefaultExtension (fname, ".zds");
    G_LoadGame (fname);
}